

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

int __thiscall cmCPackArchiveGenerator::PackageFiles(cmCPackArchiveGenerator *this)

{
  string *newdir;
  ComponentPackageMethod CVar1;
  Compress c;
  cmCPackLog *pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  uint uVar8;
  pointer remote;
  cmWorkingDirectory workdir;
  char *local_550 [4];
  string rp;
  ostringstream cmCPackLog_msg_1;
  string local_398;
  cmArchiveWrite archive;
  cmGeneratedFileStream gf;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gf);
  poVar6 = std::operator<<((ostream *)&gf,"Toplevel: ");
  newdir = &(this->super_cmCPackGenerator).toplevel;
  poVar6 = std::operator<<(poVar6,(string *)newdir);
  std::endl<char,std::char_traits<char>>(poVar6);
  pcVar2 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0x12a,_cmCPackLog_msg_1);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gf);
  iVar5 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x19])(this);
  if ((char)iVar5 != '\0') {
    CVar1 = (this->super_cmCPackGenerator).componentPackageMethod;
    if (CVar1 != ONE_PACKAGE) {
      iVar5 = PackageComponents(this,CVar1 == ONE_PACKAGE_PER_COMPONENT);
      return iVar5;
    }
    iVar5 = PackageComponentsAllInOne(this);
    return iVar5;
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&gf,None);
  cmGeneratedFileStream::Open
            (&gf,(this->super_cmCPackGenerator).packageFileNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,false,true);
  iVar5 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])(this,&gf);
  if (iVar5 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Problem to generate Header for archive <"
                            );
    poVar6 = std::operator<<(poVar6,(string *)
                                    (this->super_cmCPackGenerator).packageFileNames.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    poVar6 = std::operator<<(poVar6,">.");
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x13c,(char *)archive.Stream);
    std::__cxx11::string::~string((string *)&archive);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
    uVar8 = 0;
    goto LAB_0017c2a7;
  }
  c = this->Compress;
  iVar5 = GetThreadCount(this);
  cmArchiveWrite::cmArchiveWrite(&archive,(ostream *)&gf,c,&this->ArchiveFormat,0,iVar5);
  bVar4 = cmArchiveWrite::Open(&archive);
  if (bVar4) {
    if (archive.Error._M_string_length != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
      poVar6 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Problem to create archive <");
      poVar6 = std::operator<<(poVar6,(string *)
                                      (this->super_cmCPackGenerator).packageFileNames.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      poVar6 = std::operator<<(poVar6,">, ERROR = ");
      std::__cxx11::string::string((string *)&workdir,(string *)&archive.Error);
      poVar6 = std::operator<<(poVar6,(string *)&workdir);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&workdir);
      pcVar2 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x13c,workdir.OldDir._M_dataplus._M_p);
      goto LAB_0017c284;
    }
    cmWorkingDirectory::cmWorkingDirectory(&workdir,newdir);
    if (workdir.ResultCode == 0) {
      pbVar3 = (this->super_cmCPackGenerator).files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (remote = (this->super_cmCPackGenerator).files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; remote != pbVar3; remote = remote + 1
          ) {
        cmSystemTools::RelativePath(&rp,newdir,remote);
        std::__cxx11::string::string((string *)&local_398,(string *)&rp);
        cmArchiveWrite::Add(&archive,&local_398,0,(char *)0x0,false);
        std::__cxx11::string::~string((string *)&local_398);
        if (archive.Error._M_string_length != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
          poVar6 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Problem while adding file <");
          poVar6 = std::operator<<(poVar6,(string *)remote);
          poVar6 = std::operator<<(poVar6,"> to archive <");
          poVar6 = std::operator<<(poVar6,(string *)
                                          (this->super_cmCPackGenerator).packageFileNames.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
          poVar6 = std::operator<<(poVar6,">, ERROR = ");
          std::__cxx11::string::string((string *)local_550,(string *)&archive.Error);
          poVar6 = std::operator<<(poVar6,(string *)local_550);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)local_550);
          pcVar2 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x14d,local_550[0]);
          std::__cxx11::string::~string((string *)local_550);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
          std::__cxx11::string::~string((string *)&rp);
          break;
        }
        std::__cxx11::string::~string((string *)&rp);
      }
      uVar8 = (uint)(remote == pbVar3);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
      poVar6 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Failed to change working directory to "
                              );
      poVar6 = std::operator<<(poVar6,(string *)newdir);
      poVar6 = std::operator<<(poVar6," : ");
      pcVar7 = strerror(workdir.ResultCode);
      poVar6 = std::operator<<(poVar6,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar2 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x142,rp._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&rp);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
      uVar8 = 0;
    }
    cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Problem to open archive <");
    poVar6 = std::operator<<(poVar6,(string *)
                                    (this->super_cmCPackGenerator).packageFileNames.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    poVar6 = std::operator<<(poVar6,">, ERROR = ");
    std::__cxx11::string::string((string *)&workdir,(string *)&archive.Error);
    poVar6 = std::operator<<(poVar6,(string *)&workdir);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&workdir);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x13c,workdir.OldDir._M_dataplus._M_p);
LAB_0017c284:
    std::__cxx11::string::~string((string *)&workdir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
    uVar8 = 0;
  }
  cmArchiveWrite::~cmArchiveWrite(&archive);
LAB_0017c2a7:
  cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
  return uVar8;
}

Assistant:

int cmCPackArchiveGenerator::PackageFiles()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Toplevel: " << this->toplevel << std::endl);

  if (this->WantsComponentInstallation()) {
    // CASE 1 : COMPONENT ALL-IN-ONE package
    // If ALL COMPONENTS in ONE package has been requested
    // then the package file is unique and should be open here.
    if (this->componentPackageMethod == ONE_PACKAGE) {
      return this->PackageComponentsAllInOne();
    }
    // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
    // There will be 1 package for each component group
    // however one may require to ignore component group and
    // in this case you'll get 1 package for each component.
    return this->PackageComponents(this->componentPackageMethod ==
                                   ONE_PACKAGE_PER_COMPONENT);
  }

  // CASE 3 : NON COMPONENT package.
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0], archive);
  cmWorkingDirectory workdir(this->toplevel);
  if (workdir.Failed()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Failed to change working directory to "
                    << this->toplevel << " : "
                    << std::strerror(workdir.GetLastResult()) << std::endl);
    return 0;
  }
  for (std::string const& file : this->files) {
    // Get the relative path to the file
    std::string rp = cmSystemTools::RelativePath(this->toplevel, file);
    archive.Add(rp, 0, nullptr, false);
    if (!archive) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem while adding file <"
                      << file << "> to archive <" << this->packageFileNames[0]
                      << ">, ERROR = " << archive.GetError() << std::endl);
      return 0;
    }
  }
  // The destructor of cmArchiveWrite will close and finish the write
  return 1;
}